

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  size_type sVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  iterator pTVar5;
  long lVar6;
  pointer pTVar7;
  pointer pTVar8;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::parsing::Token> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Token *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar3 = max_size((SmallVectorBase<slang::parsing::Token> *)0x37a67b);
  if (sVar1 == sVar3) {
    detail::throwLengthError();
  }
  sVar4 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pTVar5 = begin(in_RDI);
  lVar6 = (long)__last - (long)pTVar5;
  pTVar7 = (pointer)operator_new(0x37a6da);
  pTVar8 = pTVar7 + (lVar6 >> 4);
  uVar2 = *in_RDX;
  pTVar8->kind = (short)uVar2;
  pTVar8->field_0x2 = (char)((ulong)uVar2 >> 0x10);
  pTVar8->numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
  pTVar8->rawLen = (int)((ulong)uVar2 >> 0x20);
  pTVar8->info = (Info *)in_RDX[1];
  pTVar5 = end(in_RDI);
  if (in_RSI == pTVar5) {
    __result = begin(in_RDI);
    pTVar5 = end(in_RDI);
    std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>(in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pTVar5 = end(in_RDI);
    std::uninitialized_move<slang::parsing::Token*,slang::parsing::Token*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pTVar5);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar4;
  in_RDI->data_ = pTVar7;
  return pTVar8;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}